

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

void dpfb::args::listPlugins<dpfb::FontRendererCreator>(void)

{
  int iVar1;
  FontRendererCreator *pFVar2;
  char *pcVar3;
  size_t sVar4;
  undefined4 extraout_var;
  ulong uVar5;
  
  pFVar2 = FontRendererCreator::getFirst();
  if (pFVar2 == (FontRendererCreator *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      pcVar3 = FontRendererCreator::getName(pFVar2);
      sVar4 = strlen(pcVar3);
      if (uVar5 < sVar4) {
        uVar5 = sVar4;
      }
      pFVar2 = FontRendererCreator::getNext(pFVar2);
    } while (pFVar2 != (FontRendererCreator *)0x0);
  }
  for (pFVar2 = FontRendererCreator::getFirst(); pFVar2 != (FontRendererCreator *)0x0;
      pFVar2 = FontRendererCreator::getNext(pFVar2)) {
    pcVar3 = FontRendererCreator::getName(pFVar2);
    iVar1 = (*pFVar2->_vptr_FontRendererCreator[2])(pFVar2);
    printf("  %-*s  %s\n",uVar5 & 0xffffffff,pcVar3,CONCAT44(extraout_var,iVar1));
  }
  putchar(10);
  return;
}

Assistant:

void listPlugins()
{
    std::size_t maxNameLen = 0;
    for (const auto* p = T::getFirst(); p; p = p->getNext()) {
        const auto len = std::strlen(p->getName());
        if (len > maxNameLen)
            maxNameLen = len;
    }

    for (const auto* p = T::getFirst(); p; p = p->getNext())
        std::printf(
            "  %-*s  %s\n",
            static_cast<int>(maxNameLen),
            p->getName(),
            p->getDescription());
    std::printf("\n");
}